

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_undo.cpp
# Opt level: O2

bool single_undo_register_command_proc(Am_Object *undo_handler,Am_Object *command_obj)

{
  bool bVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Wrapper *value;
  Am_Object old_command;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  Am_Object::Am_Object(&local_20,command_obj);
  bVar1 = has_impl_parent_and_set(&local_20);
  Am_Object::~Am_Object(&local_20);
  if (!bVar1) {
    local_40.data = (Am_Object_Data *)0x0;
    in_value = Am_Object::Get(undo_handler,0xc5,0);
    Am_Object::operator=(&local_40,in_value);
    bVar2 = Am_Object::Valid(&local_40);
    if (bVar2) {
      Am_Object::Am_Object(&local_28,&local_40);
      destroy_command_tree(&local_28);
      Am_Object::~Am_Object(&local_28);
    }
    Am_Object::Am_Object(&local_38,command_obj);
    copy_command_tree(&local_30);
    value = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
    Am_Object::Set(undo_handler,0xc5,value,0);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_40);
  }
  return !bVar1;
}

Assistant:

Am_Define_Method(Am_Register_Command_Method, bool, single_undo_register_command,
                 (Am_Object undo_handler, Am_Object command_obj))
{
  if (has_impl_parent_and_set(command_obj))
    return false;
  else {
    Am_Object old_command;
    old_command = undo_handler.Get(Am_COMMAND);

    if (old_command.Valid())
      destroy_command_tree(old_command);
    undo_handler.Set(Am_COMMAND, copy_command_tree(command_obj));
    return true;
  }
}